

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O0

void __thiscall Gb_Square::run(Gb_Square *this,blip_time_t time,blip_time_t end_time,int playing)

{
  byte bVar1;
  int iVar2;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  Blip_Synth<12,_1> *in_RDI;
  int delta_1;
  int phase;
  Blip_Buffer *output;
  int period;
  int delta;
  int frequency;
  int amp;
  int duty;
  int in_stack_ffffffffffffffb8;
  blip_time_t in_stack_ffffffffffffffbc;
  int local_38;
  uint local_34;
  uint local_1c;
  uint local_14;
  int local_c;
  
  local_14 = in_ECX;
  if (*(int *)((long)in_RDI->impulses + 0x3c) == 0x800) {
    local_14 = 0;
  }
  bVar1 = "\x01\x02\x04\x06"[(int)(uint)(*(uint8_t **)((long)in_RDI->impulses + 8))[1] >> 6];
  local_1c = *(int *)((long)in_RDI->impulses + 0x18) & local_14;
  if ((int)(uint)bVar1 <= *(int *)((long)in_RDI->impulses + 0x40)) {
    local_1c = -local_1c;
  }
  iVar2 = Gb_Osc::frequency((Gb_Osc *)in_RDI);
  if (0x7f8 < iVar2 - 1U) {
    local_1c = *(int *)(in_RDI->impulses + 0xc) >> 1;
    local_14 = 0;
  }
  if (local_1c != *(uint *)(in_RDI->impulses + 10)) {
    *(uint *)(in_RDI->impulses + 10) = local_1c;
    Blip_Synth<12,_1>::offset
              (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(Blip_Buffer *)0x979eba);
  }
  local_c = *(int *)(in_RDI->impulses + 8) + in_ESI;
  if (local_14 == 0) {
    local_c = in_EDX;
  }
  if (local_c < in_EDX) {
    local_34 = *(uint *)(in_RDI->impulses + 0x20);
    local_38 = local_1c << 1;
    do {
      local_34 = local_34 + 1 & 7;
      if ((local_34 == 0) || (local_34 == bVar1)) {
        local_38 = -local_38;
        Blip_Synth<12,_1>::offset_inline
                  (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   (Blip_Buffer *)0x979f5a);
      }
      local_c = (0x800 - iVar2) * 4 + local_c;
    } while (local_c < in_EDX);
    *(uint *)(in_RDI->impulses + 0x20) = local_34;
    *(int *)(in_RDI->impulses + 10) = local_38 >> 1;
  }
  *(int *)(in_RDI->impulses + 8) = local_c - in_EDX;
  return;
}

Assistant:

void Gb_Square::run( blip_time_t time, blip_time_t end_time, int playing )
{
	if ( sweep_freq == 2048 )
		playing = false;
	
	static unsigned char const table [4] = { 1, 2, 4, 6 };
	int const duty = table [regs [1] >> 6];
	int amp = volume & playing;
	if ( phase >= duty )
		amp = -amp;
	
	int frequency = this->frequency();
	if ( unsigned (frequency - 1) > 2040 ) // frequency < 1 || frequency > 2041
	{
		// really high frequency results in DC at half volume
		amp = volume >> 1;
		playing = false;
	}
	
	{
		int delta = amp - last_amp;
		if ( delta )
		{
			last_amp = amp;
			synth->offset( time, delta, output );
		}
	}
	
	time += delay;
	if ( !playing )
		time = end_time;
	
	if ( time < end_time )
	{
		int const period = (2048 - frequency) * 4;
		Blip_Buffer* const output = this->output;
		int phase = this->phase;
		int delta = amp * 2;
		do
		{
			phase = (phase + 1) & 7;
			if ( phase == 0 || phase == duty )
			{
				delta = -delta;
				synth->offset_inline( time, delta, output );
			}
			time += period;
		}
		while ( time < end_time );
		
		this->phase = phase;
		last_amp = delta >> 1;
	}
	delay = time - end_time;
}